

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkPairDetector.cpp
# Opt level: O1

void __thiscall
btGjkPairDetector::btGjkPairDetector
          (btGjkPairDetector *this,btConvexShape *objectA,btConvexShape *objectB,
          btVoronoiSimplexSolver *simplexSolver,
          btConvexPenetrationDepthSolver *penetrationDepthSolver)

{
  btScalar extraout_XMM0_Da;
  btScalar extraout_XMM0_Da_00;
  
  (this->super_btDiscreteCollisionDetectorInterface)._vptr_btDiscreteCollisionDetectorInterface =
       (_func_int **)&PTR__btDiscreteCollisionDetectorInterface_00227b58;
  (this->m_cachedSeparatingAxis).m_floats[0] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[1] = 1.0;
  (this->m_cachedSeparatingAxis).m_floats[2] = 0.0;
  (this->m_cachedSeparatingAxis).m_floats[3] = 0.0;
  this->m_penetrationDepthSolver = penetrationDepthSolver;
  this->m_simplexSolver = simplexSolver;
  this->m_minkowskiA = objectA;
  this->m_minkowskiB = objectB;
  this->m_shapeTypeA = (objectA->super_btCollisionShape).m_shapeType;
  this->m_shapeTypeB = (objectB->super_btCollisionShape).m_shapeType;
  (*(objectA->super_btCollisionShape)._vptr_btCollisionShape[0xc])(objectA);
  this->m_marginA = extraout_XMM0_Da;
  (*(objectB->super_btCollisionShape)._vptr_btCollisionShape[0xc])(objectB);
  this->m_marginB = extraout_XMM0_Da_00;
  this->m_ignoreMargin = false;
  this->m_lastUsedMethod = -1;
  this->m_catchDegeneracies = 1;
  this->m_fixContactNormalDirection = 1;
  return;
}

Assistant:

btGjkPairDetector::btGjkPairDetector(const btConvexShape* objectA,const btConvexShape* objectB,btSimplexSolverInterface* simplexSolver,btConvexPenetrationDepthSolver*	penetrationDepthSolver)
:m_cachedSeparatingAxis(btScalar(0.),btScalar(1.),btScalar(0.)),
m_penetrationDepthSolver(penetrationDepthSolver),
m_simplexSolver(simplexSolver),
m_minkowskiA(objectA),
m_minkowskiB(objectB),
m_shapeTypeA(objectA->getShapeType()),
m_shapeTypeB(objectB->getShapeType()),
m_marginA(objectA->getMargin()),
m_marginB(objectB->getMargin()),
m_ignoreMargin(false),
m_lastUsedMethod(-1),
m_catchDegeneracies(1),
m_fixContactNormalDirection(1)
{
}